

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimInfo.cpp
# Opt level: O2

int OpenMD::getGlobalCountOfType(AtomType *param_1)

{
  return 0;
}

Assistant:

int getGlobalCountOfType(AtomType*) {
    /*
    AtomTypeSet atypes = getSimulatedAtomTypes();
    map<AtomType*, int> counts_;

    for(mol = beginMolecule(mi); mol != NULL; mol = nextMolecule(mi)) {
    for(atom = mol->beginAtom(ai); atom != NULL;
    atom = mol->nextAtom(ai)) {
    atom->getAtomType();
    }
    }
  */
    return 0;
  }